

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O1

cali_id_t cali_create_channel(char *name,int flags,cali_configset_t cfgset)

{
  bool allow;
  cali_id_t cVar1;
  Channel channel;
  RuntimeConfig cfg;
  Caliper c;
  undefined1 local_60 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  Caliper local_40;
  
  cali::RuntimeConfig::RuntimeConfig((RuntimeConfig *)(local_60 + 0x10));
  cali::RuntimeConfig::allow_read_env((RuntimeConfig *)(local_60 + 0x10),allow);
  cali::RuntimeConfig::import((RuntimeConfig *)(local_60 + 0x10),&cfgset->cfgset);
  cali::Caliper::Caliper(&local_40);
  cali::Caliper::create_channel((Caliper *)local_60,(char *)&local_40,(RuntimeConfig *)name);
  cVar1 = 0xffffffffffffffff;
  if (((GlobalData *)local_60._8_8_ != (GlobalData *)0x0) &&
     (0 < *(_Atomic_word *)(local_60._8_8_ + 8))) {
    if ((flags & 1U) == 0) {
      cali::Caliper::activate_channel(&local_40,(Channel *)local_60);
    }
    cVar1 = cali::Channel::id((Channel *)local_60);
  }
  cali::Channel::~Channel((Channel *)local_60);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return cVar1;
}

Assistant:

cali_id_t cali_create_channel(const char* name, int flags, cali_configset_t cfgset)
{
    RuntimeConfig cfg;

    cfg.allow_read_env(flags & CALI_CHANNEL_ALLOW_READ_ENV);
    cfg.import(cfgset->cfgset);

    Caliper c;
    Channel channel = c.create_channel(name, cfg);

    if (!channel)
        return CALI_INV_ID;
    if (!(flags & CALI_CHANNEL_LEAVE_INACTIVE))
        c.activate_channel(channel);

    return channel.id();
}